

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_7f1d8::testOptional(void)

{
  bool bVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[6]> _Var2;
  ostream *poVar3;
  undefined1 local_b0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  cmJSONState state;
  Value v;
  
  Json::Value::Value((Value *)((long)&state.doc.field_2 + 8),"Hello");
  cmJSONState::cmJSONState
            ((cmJSONState *)
             &str.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_char_(&)[8],_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b0,(char (*) [8])0x1295a93);
  bVar1 = std::
          function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()((function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                        *)(anonymous_namespace)::OptionalStringHelper_abi_cxx11_,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b0,(Value *)((long)&state.doc.field_2 + 8),
                       (cmJSONState *)
                       &str.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged);
  if (bVar1) {
    _Var2 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_b0,(char (*) [6])"Hello");
    if (_Var2) {
      std::optional<std::__cxx11::string>::emplace<char_const(&)[8]>
                ((optional<std::__cxx11::string> *)local_b0,(char (*) [8])0x1295a93);
      bVar1 = std::
              function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::OptionalStringHelper_abi_cxx11_,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_b0,(Value *)0x0,
                           (cmJSONState *)
                           &str.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
      if (bVar1) {
        bVar1 = std::operator==(local_b0);
        if (bVar1) {
          v.limit_._7_1_ = true;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(str == cm::nullopt) failed on line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1ba);
          std::operator<<(poVar3,"\n");
          v.limit_._7_1_ = false;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(OptionalStringHelper(str, nullptr, &state)) failed on line "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b9);
        std::operator<<(poVar3,"\n");
        v.limit_._7_1_ = false;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line "
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b6);
      std::operator<<(poVar3,"\n");
      v.limit_._7_1_ = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(OptionalStringHelper(str, &v, &state)) failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b5);
    std::operator<<(poVar3,"\n");
    v.limit_._7_1_ = false;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b0);
  cmJSONState::~cmJSONState
            ((cmJSONState *)
             &str.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  Json::Value::~Value((Value *)((long)&state.doc.field_2 + 8));
  return v.limit_._7_1_;
}

Assistant:

bool testOptional()
{
  Json::Value v = "Hello";
  cmJSONState state;

  cm::optional<std::string> str{ "default" };
  ASSERT_TRUE(OptionalStringHelper(str, &v, &state));
  ASSERT_TRUE(str == "Hello");

  str.emplace("default");
  ASSERT_TRUE(OptionalStringHelper(str, nullptr, &state));
  ASSERT_TRUE(str == cm::nullopt);

  return true;
}